

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

float tcu::anon_unknown_3::minimalRangeDivision
                (float minDividend,float maxDividend,float minDivisor,float maxDivisor)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  undefined1 in_register_00001204 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_XMM1_Db;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  
  auVar5._4_12_ = in_register_00001204;
  auVar5._0_4_ = minDividend;
  fVar8 = 0.0;
  if ((((minDividend != 0.0) || (NAN(minDividend))) || (maxDividend != 0.0)) || (NAN(maxDividend)))
  {
    if ((0.0 < minDivisor) || (maxDivisor < 0.0)) {
      auVar7._0_8_ = auVar5._0_8_;
      auVar7._8_4_ = in_register_00001204._0_4_;
      auVar7._12_4_ = in_XMM1_Db;
      auVar4._8_8_ = auVar7._8_8_;
      auVar4._4_4_ = maxDividend;
      auVar4._0_4_ = minDividend;
      auVar9._4_4_ = minDivisor;
      auVar9._0_4_ = minDivisor;
      auVar9._8_4_ = minDivisor;
      auVar9._12_4_ = minDivisor;
      auVar6._4_4_ = maxDividend;
      auVar6._0_4_ = minDividend;
      auVar6._8_4_ = in_register_00001204._0_4_;
      auVar6._12_4_ = in_XMM1_Db;
      auVar7 = divps(auVar6,auVar9);
      auVar1._4_4_ = maxDivisor;
      auVar1._0_4_ = maxDivisor;
      auVar1._8_4_ = maxDivisor;
      auVar1._12_4_ = maxDivisor;
      auVar5 = divps(auVar4,auVar1);
      uVar2 = -(uint)(auVar7._0_4_ <= auVar5._0_4_);
      uVar3 = -(uint)(auVar7._4_4_ <= auVar5._4_4_);
      fVar8 = (float)(~uVar2 & (uint)auVar5._0_4_ | (uint)auVar7._0_4_ & uVar2);
      fVar10 = (float)(~uVar3 & (uint)auVar5._4_4_ | (uint)auVar7._4_4_ & uVar3);
      uVar2 = -(uint)(fVar8 <= fVar10);
      fVar8 = (float)(~uVar2 & (uint)fVar10 | (uint)fVar8 & uVar2);
    }
    else {
      fVar8 = -INFINITY;
    }
  }
  return fVar8;
}

Assistant:

float minimalRangeDivision (float minDividend, float maxDividend, float minDivisor, float maxDivisor)
{
	DE_ASSERT(minDividend <= maxDividend);
	DE_ASSERT(minDivisor <= maxDivisor);

	// special cases
	if (minDividend == 0.0f && maxDividend == 0.0f)
		return 0.0f;
	if (minDivisor <= 0.0f && maxDivisor >= 0.0f)
		return -std::numeric_limits<float>::infinity();

	return de::min(de::min(minDividend / minDivisor, minDividend / maxDivisor), de::min(maxDividend / minDivisor, maxDividend / maxDivisor));
}